

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_fill_circle(nk_command_buffer *b,nk_rect r,nk_color c)

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = r.w;
  fVar6 = r.h;
  fVar3 = r.x;
  fVar4 = r.y;
  if (b != (nk_command_buffer *)0x0) {
    if ((((0xffffff < (uint)c) && ((fVar5 != 0.0 || (NAN(fVar5))))) &&
        ((fVar6 != 0.0 || (NAN(fVar6))))) &&
       ((b->use_clipping == 0 ||
        ((((fVar1 = (b->clip).x, fVar1 <= fVar3 + fVar5 && (fVar3 <= fVar1 + (b->clip).w)) &&
          (fVar1 = (b->clip).y, fVar1 <= fVar4 + fVar6)) && (fVar4 <= fVar1 + (b->clip).h)))))) {
      pvVar2 = nk_command_buffer_push(b,NK_COMMAND_CIRCLE_FILLED,0x20);
      if (pvVar2 != (void *)0x0) {
        *(short *)((long)pvVar2 + 0x10) = (short)(int)fVar3;
        *(short *)((long)pvVar2 + 0x12) = (short)(int)fVar4;
        fVar3 = 0.0;
        if (0.0 <= fVar5) {
          fVar3 = fVar5;
        }
        *(short *)((long)pvVar2 + 0x14) = (short)(int)fVar3;
        fVar3 = 0.0;
        if (0.0 <= fVar6) {
          fVar3 = fVar6;
        }
        *(short *)((long)pvVar2 + 0x16) = (short)(int)fVar3;
        *(short *)((long)pvVar2 + 0x18) = c._0_2_;
        *(nk_byte *)((long)pvVar2 + 0x1a) = c.b;
        *(nk_byte *)((long)pvVar2 + 0x1b) = c.a;
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x187b,
                "void nk_fill_circle(struct nk_command_buffer *, struct nk_rect, struct nk_color)");
}

Assistant:

NK_API void
nk_fill_circle(struct nk_command_buffer *b, struct nk_rect r, struct nk_color c)
{
    struct nk_command_circle_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || r.w == 0 || r.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(r.x, r.y, r.w, r.h, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_circle_filled*)
        nk_command_buffer_push(b, NK_COMMAND_CIRCLE_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(r.w, 0);
    cmd->h = (unsigned short)NK_MAX(r.h, 0);
    cmd->color = c;
}